

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

Vector * operator/(Vector *__return_storage_ptr__,Vector *l,double lambda)

{
  double lambda_local;
  Vector *l_local;
  
  operator*(__return_storage_ptr__,l,1.0 / lambda);
  return __return_storage_ptr__;
}

Assistant:

Vector operator/(const Vector& l, double lambda)
{
	return l * (1 / lambda);
}